

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_crld.cc
# Opt level: O1

int i2r_crldp(X509V3_EXT_METHOD *method,void *pcrldp,BIO *out,int indent)

{
  size_t sVar1;
  undefined8 *puVar2;
  size_t sVar3;
  
  sVar1 = OPENSSL_sk_num((OPENSSL_STACK *)pcrldp);
  if (sVar1 != 0) {
    sVar1 = 0;
    do {
      BIO_puts((BIO *)out,"\n");
      puVar2 = (undefined8 *)OPENSSL_sk_value((OPENSSL_STACK *)pcrldp,sVar1);
      if ((DIST_POINT_NAME *)*puVar2 != (DIST_POINT_NAME *)0x0) {
        print_distpoint(out,(DIST_POINT_NAME *)*puVar2,indent);
      }
      if ((ASN1_BIT_STRING *)puVar2[1] != (ASN1_BIT_STRING *)0x0) {
        print_reasons(out,"Reasons",(ASN1_BIT_STRING *)puVar2[1],indent);
      }
      if (puVar2[2] != 0) {
        BIO_printf((BIO *)out,"%*sCRL Issuer:\n",(ulong)(uint)indent,"");
        print_gens(out,(stack_st_GENERAL_NAME *)puVar2[2],indent);
      }
      sVar1 = sVar1 + 1;
      sVar3 = OPENSSL_sk_num((OPENSSL_STACK *)pcrldp);
    } while (sVar1 < sVar3);
  }
  return 1;
}

Assistant:

static int i2r_crldp(const X509V3_EXT_METHOD *method, void *pcrldp, BIO *out,
                     int indent) {
  STACK_OF(DIST_POINT) *crld = reinterpret_cast<STACK_OF(DIST_POINT) *>(pcrldp);
  DIST_POINT *point;
  size_t i;
  for (i = 0; i < sk_DIST_POINT_num(crld); i++) {
    BIO_puts(out, "\n");
    point = sk_DIST_POINT_value(crld, i);
    if (point->distpoint) {
      print_distpoint(out, point->distpoint, indent);
    }
    if (point->reasons) {
      print_reasons(out, "Reasons", point->reasons, indent);
    }
    if (point->CRLissuer) {
      BIO_printf(out, "%*sCRL Issuer:\n", indent, "");
      print_gens(out, point->CRLissuer, indent);
    }
  }
  return 1;
}